

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowReturnOneRow(WindowCodeArg *p)

{
  int iVar1;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  FuncDef *pFVar2;
  char *pcVar3;
  byte bVar4;
  u8 uVar5;
  int iVar6;
  int iVar7;
  KeyInfo *p_01;
  Op *pOVar8;
  int iVar9;
  int iVar10;
  int op;
  int iVar11;
  Window *pWin;
  Window *pWVar12;
  int local_6c;
  int local_64;
  int local_60;
  int local_5c;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  pWVar12 = pMWin;
  if (pMWin->regStartRowid == 0) {
    do {
      pFVar2 = pWVar12->pWFunc;
      pcVar3 = pFVar2->zName;
      if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
        iVar7 = pWVar12->csrApp;
        iVar10 = pParse->nLabel + -1;
        pParse->nLabel = iVar10;
        if (pParse->nTempReg == '\0') {
          iVar6 = pParse->nMem + 1;
          pParse->nMem = iVar6;
        }
        else {
          bVar4 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar4;
          iVar6 = pParse->aTempReg[bVar4];
        }
        sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar12->regResult,0);
        if (pFVar2->zName == "nth_value") {
          sqlite3VdbeAddOp3(p_00,0x5e,pMWin->iEphCsr,pWVar12->iArgCol + 1,iVar6);
          windowCheckValue(pParse,iVar6,2);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x47,1,iVar6,0);
        }
        sqlite3VdbeAddOp3(p_00,0x6a,iVar6,pWVar12->regApp,iVar6);
        sqlite3VdbeAddOp3(p_00,0x36,pWVar12->regApp + 1,iVar10,iVar6);
        sqlite3VdbeAddOp3(p_00,0x1e,iVar7,0,iVar6);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar7,pWVar12->iArgCol,pWVar12->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar10);
        if (iVar6 != 0) {
          bVar4 = pParse->nTempReg;
joined_r0x00191ea9:
          if (bVar4 < 8) {
            pParse->nTempReg = bVar4 + 1;
            pParse->aTempReg[bVar4] = iVar6;
          }
        }
      }
      else {
        if (pcVar3 != "lead" && pcVar3 != "lag") goto LAB_00191ebb;
        iVar7 = ((pWVar12->pOwner->x).pList)->nExpr;
        iVar10 = pWVar12->csrApp;
        iVar11 = pParse->nLabel + -1;
        pParse->nLabel = iVar11;
        if (pParse->nTempReg == '\0') {
          iVar6 = pParse->nMem + 1;
          pParse->nMem = iVar6;
        }
        else {
          bVar4 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar4;
          iVar6 = pParse->aTempReg[bVar4];
        }
        iVar1 = pMWin->iEphCsr;
        if (iVar7 < 3) {
          sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar12->regResult,0);
          sqlite3VdbeAddOp3(p_00,0x87,iVar1,iVar6,0);
          if (iVar7 == 2) goto LAB_00191dc7;
          sqlite3VdbeAddOp3(p_00,0x56,iVar6,(uint)(pFVar2->zName == "lead") * 2 + -1,0);
        }
        else {
          sqlite3VdbeAddOp3(p_00,0x5e,iVar1,pWVar12->iArgCol + 2,pWVar12->regResult);
          sqlite3VdbeAddOp3(p_00,0x87,iVar1,iVar6,0);
LAB_00191dc7:
          pcVar3 = pFVar2->zName;
          if (pParse->nTempReg == '\0') {
            iVar7 = pParse->nMem + 1;
            pParse->nMem = iVar7;
          }
          else {
            bVar4 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar4;
            iVar7 = pParse->aTempReg[bVar4];
          }
          sqlite3VdbeAddOp3(p_00,0x5e,iVar1,pWVar12->iArgCol + 1,iVar7);
          sqlite3VdbeAddOp3(p_00,pcVar3 == "lead" ^ 0x6b,iVar7,iVar6,iVar6);
          if (iVar7 != 0) {
            bVar4 = pParse->nTempReg;
            if ((ulong)bVar4 < 8) {
              pParse->nTempReg = bVar4 + 1;
              pParse->aTempReg[bVar4] = iVar7;
            }
          }
        }
        sqlite3VdbeAddOp3(p_00,0x1e,iVar10,iVar11,iVar6);
        sqlite3VdbeAddOp3(p_00,0x5e,iVar10,pWVar12->iArgCol,pWVar12->regResult);
        sqlite3VdbeResolveLabel(p_00,iVar11);
        if (iVar6 != 0) {
          bVar4 = pParse->nTempReg;
          goto joined_r0x00191ea9;
        }
      }
LAB_00191ebb:
      pWVar12 = pWVar12->pNextWin;
    } while (pWVar12 != (Window *)0x0);
    goto LAB_001922b9;
  }
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = pMWin->pOrderBy->nExpr;
  }
  iVar10 = pMWin->csrApp;
  iVar11 = pParse->nLabel;
  iVar7 = iVar11 + -2;
  pParse->nLabel = iVar7;
  uVar5 = pParse->nTempReg;
  if (uVar5 == '\0') {
    iVar6 = pParse->nMem + 1;
    local_64 = iVar6;
LAB_00191f26:
    iVar6 = iVar6 + 1;
    pParse->nMem = iVar6;
  }
  else {
    bVar4 = uVar5 - 1;
    pParse->nTempReg = bVar4;
    local_64 = pParse->aTempReg[bVar4];
    if (bVar4 == 0) {
      iVar6 = pParse->nMem;
      goto LAB_00191f26;
    }
    pParse->nTempReg = uVar5 - 2;
    iVar6 = pParse->aTempReg[(byte)(uVar5 - 2)];
  }
  if (local_6c == 0) {
    local_60 = 0;
    local_5c = 0;
  }
  else {
    local_5c = sqlite3GetTempRange(pParse,local_6c);
    local_60 = sqlite3GetTempRange(pParse,local_6c);
  }
  iVar11 = iVar11 + -1;
  sqlite3VdbeAddOp3(p_00,0x87,pMWin->iEphCsr,local_64,0);
  windowReadPeerValues(p,pMWin->iEphCsr,local_5c);
  do {
    sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar12->regAccum,0);
    pWVar12 = pWVar12->pNextWin;
  } while (pWVar12 != (Window *)0x0);
  sqlite3VdbeAddOp3(p_00,0x17,iVar10,iVar7,pMWin->regStartRowid);
  iVar1 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x87,iVar10,iVar6,0);
  sqlite3VdbeAddOp3(p_00,0x36,pMWin->regEndRowid,iVar7,iVar6);
  uVar5 = pMWin->eExclude;
  if (uVar5 != 'B') {
    if (uVar5 == 'U') {
      sqlite3VdbeAddOp3(p_00,0x35,local_64,iVar11,iVar6);
    }
    else {
      iVar7 = 0;
      if (pMWin->pOrderBy == (ExprList *)0x0) {
        p_01 = (KeyInfo *)0x0;
      }
      else {
        p_01 = sqlite3KeyInfoFromExprList(pParse,pMWin->pOrderBy,0,0);
        uVar5 = pMWin->eExclude;
      }
      if (uVar5 == '^') {
        iVar7 = sqlite3VdbeAddOp3(p_00,0x35,local_64,0,iVar6);
      }
      if (p_01 == (KeyInfo *)0x0) {
        op = 9;
        iVar9 = 0;
      }
      else {
        windowReadPeerValues(p,iVar10,local_60);
        sqlite3VdbeAddOp3(p_00,0x5a,local_60,local_5c,local_6c);
        if (p_00->db->mallocFailed == '\0') {
          pOVar8 = p_00->aOp;
          iVar9 = p_00->nOp;
          pOVar8[(long)iVar9 + -1].p4type = -8;
          pOVar8[(long)iVar9 + -1].p4.pKeyInfo = p_01;
        }
        else if ((p_00->db->pnBytesFreed == (int *)0x0) &&
                (p_01->nRef = p_01->nRef - 1, p_01->nRef == 0)) {
          sqlite3DbNNFreeNN(p_01->db,p_01);
        }
        iVar9 = p_00->nOp + 1;
        op = 0xe;
      }
      sqlite3VdbeAddOp3(p_00,op,iVar9,iVar11,iVar9);
      if (iVar7 != 0) {
        if (p_00->db->mallocFailed == '\0') {
          pOVar8 = p_00->aOp + iVar7;
        }
        else {
          pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar8->p2 = p_00->nOp;
      }
    }
  }
  windowAggStep(p,pMWin,iVar10,0,p->regArg);
  sqlite3VdbeResolveLabel(p_00,iVar11);
  sqlite3VdbeAddOp3(p_00,0x27,iVar10,iVar1,0);
  iVar7 = p_00->nOp;
  if (p_00->db->mallocFailed == '\0') {
    pOVar8 = p_00->aOp + (long)iVar1 + 1;
    p_00->aOp[(long)iVar1 + -1].p2 = iVar7;
  }
  else {
    pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
    DAT_001e99e8 = iVar7;
  }
  pOVar8->p2 = iVar7;
  if (iVar6 != 0) {
    bVar4 = pParse->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse->nTempReg = bVar4 + 1;
      pParse->aTempReg[bVar4] = iVar6;
    }
  }
  if (local_64 != 0) {
    bVar4 = pParse->nTempReg;
    if ((ulong)bVar4 < 8) {
      pParse->nTempReg = bVar4 + 1;
      pParse->aTempReg[bVar4] = local_64;
    }
  }
  if (local_6c != 0) {
    if (local_6c == 1) {
      if (local_60 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = local_60;
        }
      }
      if (local_5c != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = local_5c;
        }
      }
    }
    else if (pParse->nRangeReg < local_6c) {
      pParse->nRangeReg = local_6c;
      pParse->iRangeReg = local_60;
    }
  }
  windowAggFinal((WindowCodeArg *)p->pParse,(int)p->pMWin);
LAB_001922b9:
  sqlite3VdbeAddOp3(p_00,10,p->regGosub,p->addrGosub,0);
  return;
}

Assistant:

static void windowReturnOneRow(WindowCodeArg *p){
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  if( pMWin->regStartRowid ){
    windowFullScan(p);
  }else{
    Parse *pParse = p->pParse;
    Window *pWin;

    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      FuncDef *pFunc = pWin->pWFunc;
      assert( ExprUseXList(pWin->pOwner) );
      if( pFunc->zName==nth_valueName
       || pFunc->zName==first_valueName
      ){
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

        if( pFunc->zName==nth_valueName ){
          sqlite3VdbeAddOp3(v, OP_Column,pMWin->iEphCsr,pWin->iArgCol+1,tmpReg);
          windowCheckValue(pParse, tmpReg, 2);
        }else{
          sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
        }
        sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
        sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
        VdbeCoverageNeverNull(v);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
      else if( pFunc->zName==leadName || pFunc->zName==lagName ){
        int nArg = pWin->pOwner->x.pList->nExpr;
        int csr = pWin->csrApp;
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int tmpReg = sqlite3GetTempReg(pParse);
        int iEph = pMWin->iEphCsr;

        if( nArg<3 ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
        }else{
          sqlite3VdbeAddOp3(v, OP_Column, iEph,pWin->iArgCol+2,pWin->regResult);
        }
        sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
        if( nArg<2 ){
          int val = (pFunc->zName==leadName ? 1 : -1);
          sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
        }else{
          int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
          int tmpReg2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
          sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
          sqlite3ReleaseTempReg(pParse, tmpReg2);
        }

        sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
        VdbeCoverage(v);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
        sqlite3VdbeResolveLabel(v, lbl);
        sqlite3ReleaseTempReg(pParse, tmpReg);
      }
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, p->regGosub, p->addrGosub);
}